

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall person::operator==(person *this,person *rhs)

{
  bool bVar1;
  undefined1 local_38 [32];
  person *local_18;
  person *rhs_local;
  person *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  as_tuple_abi_cxx11_<person_const&,void>((person *)(local_38 + 0x10));
  as_tuple_abi_cxx11_<person_const&,void>((person *)local_38);
  bVar1 = std::operator==((tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                           *)(local_38 + 0x10),
                          (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
                           *)local_38);
  return bVar1;
}

Assistant:

bool operator==(person const& rhs) const noexcept {
        return as_tuple(*this) == as_tuple(rhs);
    }